

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall bsplib::Rdma::write_puts(Rdma *this)

{
  A2A *a2a;
  ulong uVar1;
  pointer puVar2;
  int iVar3;
  long lVar4;
  Time t;
  size_t dst_offset;
  size_t dst_slot;
  timespec local_78;
  unsigned_long local_60;
  unsigned_long local_58;
  TicToc local_50;
  
  local_50.m_record = TicToc::push(PUT);
  clock_gettime(1,&local_78);
  local_50.m_start.tv_sec = local_78.tv_sec;
  local_50.m_start.tv_nsec = local_78.tv_nsec;
  local_50.m_nbytes = 0;
  iVar3 = this->m_nprocs;
  if (0 < iVar3) {
    a2a = &this->m_second_exchange;
    puVar2 = (this->m_second_exchange).m_recv_pos.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      uVar1 = (this->m_recv_actions).m_get_buffer_offset.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      puVar2[lVar4] = 0;
      if (uVar1 != 0) {
        do {
          iVar3 = (int)lVar4;
          deserial<unsigned_long>(a2a,iVar3,(unsigned_long *)&local_78);
          deserial<unsigned_long>(a2a,iVar3,&local_58);
          deserial<unsigned_long>(a2a,iVar3,&local_60);
          memcpy((void *)((long)(this->m_used_slots).
                                super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [(long)this->m_nprocs * local_58 + (long)this->m_pid].addr +
                         local_60),
                 (this->m_second_exchange).m_recv_bufs.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start +
                 (this->m_second_exchange).m_recv_pos.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4] +
                 (this->m_second_exchange).m_recv_cap * lVar4,local_78.tv_sec);
          puVar2 = (this->m_second_exchange).m_recv_pos.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)local_78.tv_sec <=
              (this->m_second_exchange).m_recv_sizes.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4] - puVar2[lVar4]) {
            puVar2[lVar4] = puVar2[lVar4] + local_78.tv_sec;
          }
        } while (puVar2[lVar4] < uVar1);
        iVar3 = this->m_nprocs;
      }
      local_50.m_nbytes = local_50.m_nbytes + uVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  TicToc::~TicToc(&local_50);
  return;
}

Assistant:

void Rdma::write_puts()
{
#ifdef PROFILE
    TicToc t(TicToc::PUT);
#endif
    for (int p = 0; p < m_nprocs; ++p){
        size_t end = m_recv_actions.m_get_buffer_offset[p];
        m_second_exchange.recv_rewind( p );
        while ( m_second_exchange.recv_pos( p ) < end ) {
            size_t size, dst_slot, dst_offset;
            deserial( m_second_exchange, p, size );
            deserial( m_second_exchange, p, dst_slot);
            deserial( m_second_exchange, p, dst_offset );
           
            char * dst_addr =
               static_cast<char *>(slot( m_pid, dst_slot ).addr );
            dst_addr += dst_offset;
            std::memcpy( dst_addr, m_second_exchange.recv_top(p), size );
            m_second_exchange.recv_pop(p, size );
        }
#ifdef PROFILE
        t.add_bytes( end );
#endif
   }
}